

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaConfig.cpp
# Opt level: O0

void __thiscall xmrig::CudaConfig::setDevicesHint(CudaConfig *this,char *devicesHint)

{
  bool bVar1;
  reference this_00;
  long in_RSI;
  long in_RDI;
  String *index;
  const_iterator __end1;
  const_iterator __begin1;
  vector<xmrig::String,_std::allocator<xmrig::String>_> *__range1;
  vector<xmrig::String,_std::allocator<xmrig::String>_> indexes;
  vector<xmrig::String,_std::allocator<xmrig::String>_> *in_stack_ffffffffffffff68;
  String *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  String *this_01;
  size_type in_stack_ffffffffffffff98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<const_xmrig::String_*,_std::vector<xmrig::String,_std::allocator<xmrig::String>_>_>
  local_58;
  vector<xmrig::String,_std::allocator<xmrig::String>_> *local_50;
  char in_stack_ffffffffffffffc7;
  String *in_stack_ffffffffffffffc8;
  vector<xmrig::String,_std::allocator<xmrig::String>_> local_28;
  
  if (in_RSI != 0) {
    this_01 = (String *)&stack0xffffffffffffffc8;
    String::String(this_01,in_stack_ffffffffffffff78);
    String::split(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc7);
    String::~String(in_stack_ffffffffffffff70);
    std::vector<xmrig::String,_std::allocator<xmrig::String>_>::size(&local_28);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_50 = &local_28;
    local_58._M_current =
         (String *)
         std::vector<xmrig::String,_std::allocator<xmrig::String>_>::begin
                   (in_stack_ffffffffffffff68);
    std::vector<xmrig::String,_std::allocator<xmrig::String>_>::end(in_stack_ffffffffffffff68);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_xmrig::String_*,_std::vector<xmrig::String,_std::allocator<xmrig::String>_>_>
                               *)in_stack_ffffffffffffff70,
                              (__normal_iterator<const_xmrig::String_*,_std::vector<xmrig::String,_std::allocator<xmrig::String>_>_>
                               *)in_stack_ffffffffffffff68), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_xmrig::String_*,_std::vector<xmrig::String,_std::allocator<xmrig::String>_>_>
                ::operator*(&local_58);
      in_stack_ffffffffffffff68 =
           (vector<xmrig::String,_std::allocator<xmrig::String>_> *)(in_RDI + 8);
      in_stack_ffffffffffffff70 = (String *)String::operator_cast_to_char_(this_00);
      strtoul((char *)in_stack_ffffffffffffff70,(char **)0x0,10);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff70,
                 (value_type_conflict3 *)in_stack_ffffffffffffff68);
      __gnu_cxx::
      __normal_iterator<const_xmrig::String_*,_std::vector<xmrig::String,_std::allocator<xmrig::String>_>_>
      ::operator++(&local_58);
    }
    std::vector<xmrig::String,_std::allocator<xmrig::String>_>::~vector
              ((vector<xmrig::String,_std::allocator<xmrig::String>_> *)this_01);
  }
  return;
}

Assistant:

void xmrig::CudaConfig::setDevicesHint(const char *devicesHint)
{
    if (devicesHint == nullptr) {
        return;
    }

    const auto indexes = String(devicesHint).split(',');
    m_devicesHint.reserve(indexes.size());

    for (const auto &index : indexes) {
        m_devicesHint.push_back(strtoul(index, nullptr, 10));
    }
}